

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::SetNotNullInfo::Deserialize(SetNotNullInfo *this,Deserializer *deserializer)

{
  tuple<duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_> this_00;
  pointer pSVar1;
  __uniq_ptr_impl<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>_> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>.
  super__Head_base<0UL,_duckdb::SetNotNullInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>)
       operator_new(0x98);
  SetNotNullInfo((SetNotNullInfo *)
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>
                 .super__Head_base<0UL,_duckdb::SetNotNullInfo_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>.
  super__Head_base<0UL,_duckdb::SetNotNullInfo_*,_false>._M_head_impl =
       (tuple<duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>)
       (tuple<duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>
       .super__Head_base<0UL,_duckdb::SetNotNullInfo_*,_false>._M_head_impl;
  pSVar1 = unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>::
           operator->((unique_ptr<duckdb::SetNotNullInfo,_std::default_delete<duckdb::SetNotNullInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"column_name",&pSVar1->column_name);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::SetNotNullInfo_*,_std::default_delete<duckdb::SetNotNullInfo>_>
       .super__Head_base<0UL,_duckdb::SetNotNullInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> SetNotNullInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetNotNullInfo>(new SetNotNullInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	return std::move(result);
}